

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool do_vfp_2op_dp(DisasContext_conflict1 *s,VFPGen2OpDPFn_conflict *fn,int vd,int vm)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i64 var;
  TCGv_i64 var_00;
  uint uVar2;
  int iVar3;
  uint reg;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  uVar2 = s->isar->mvfr0;
  if ((uVar2 & 0xf00) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar3 = s->vec_len;
    if ((((uVar2 & 0xe) != 0) || (((vm | vd) & 0x10U) == 0)) &&
       (((uVar2 & 0xf000000) != 0 || ((iVar3 == 0 && (s->vec_stride == 0)))))) {
      _Var1 = vfp_access_check(s);
      if (!_Var1) {
        return true;
      }
      if (iVar3 < 1) {
        uVar2 = 0;
        uVar4 = 0;
      }
      else if ((vd & 0xcU) == 0) {
        uVar2 = 0;
        iVar3 = 0;
        uVar4 = 0;
      }
      else {
        uVar2 = (s->vec_stride >> 1) + 1;
        uVar4 = vm & 0xcU;
        if ((vm & 0xcU) != 0) {
          uVar4 = uVar2;
        }
      }
      var = tcg_temp_new_i64(tcg_ctx);
      var_00 = tcg_temp_new_i64(tcg_ctx);
      neon_load_reg64(tcg_ctx,var,vm);
      iVar5 = iVar3;
      reg = vd;
      while( true ) {
        (*fn)(tcg_ctx,var_00,var);
        neon_store_reg64(tcg_ctx,var_00,reg);
        bVar6 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar6) break;
        if (uVar4 == 0) goto LAB_005f7e79;
        neon_load_reg64(tcg_ctx,var,vm);
        reg = vm & 0xfffffffcU | vm + uVar4 & 3;
      }
      goto LAB_005f7e7e;
    }
  }
  return false;
LAB_005f7e79:
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    vd = vd & 0xfffffffcU | uVar2 + vd & 3;
    neon_store_reg64(tcg_ctx,var_00,vd);
  }
LAB_005f7e7e:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
  return true;
}

Assistant:

static bool do_vfp_2op_dp(DisasContext *s, VFPGen2OpDPFn *fn, int vd, int vm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 f0, fd;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((vd | vm) & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;

            if (vfp_dreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i64(tcg_ctx);
    fd = tcg_temp_new_i64(tcg_ctx);

    neon_load_reg64(tcg_ctx, f0, vm);

    for (;;) {
        fn(tcg_ctx, fd, f0);
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        if (delta_m == 0) {
            /* single source one-many */
            while (veclen--) {
                vd = vfp_advance_dreg(vd, delta_d);
                neon_store_reg64(tcg_ctx, fd, vd);
            }
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
        vd = vfp_advance_dreg(vm, delta_m);
        neon_load_reg64(tcg_ctx, f0, vm);
    }

    tcg_temp_free_i64(tcg_ctx, f0);
    tcg_temp_free_i64(tcg_ctx, fd);

    return true;
}